

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory_tests.cc
# Opt level: O3

bool lf::mesh::hybrid2d::test::mesh_sanity_check(Mesh *mesh)

{
  long *plVar1;
  undefined1 uVar2;
  int iVar3;
  shared_ptr<spdlog::logger> *psVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  Geometry *geo;
  long extraout_RDX;
  pair<lf::base::RefEl,_unsigned_int> *geo_errs;
  pointer this;
  pointer *__ptr;
  char *message;
  long lVar6;
  vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  fails;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  AssertHelper local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  double local_88;
  double local_80;
  vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  local_78;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Mesh sanity: Checking entity indexing",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  test_utils::checkEntityIndexing(mesh);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Mesh sanity: Checking mesh completeness",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  test_utils::checkMeshCompleteness(mesh);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Mesh sanity: Checking geometry compatibility: ",0x2e);
  std::ostream::flush();
  psVar4 = test_utils::WatertightLogger();
  spdlog::logger::set_level
            ((psVar4->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,trace);
  test_utils::isWatertightMesh(&local_78,mesh,false);
  local_b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_78.
              super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_78.
              super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_b0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_a8,"fails.size()","0",(unsigned_long *)&local_b8,(int *)&local_b0);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_b8._M_head_impl + 0x10),"Inconsistent geometry!",0x16);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x20,message);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_58 = local_78.
             super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_60 = local_78.
             super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.
      super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"consistent!",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    iVar3 = (*mesh->_vptr_Mesh[2])(mesh,0);
    if (extraout_RDX == 0) {
      local_88 = 0.0;
    }
    else {
      local_88 = 0.0;
      lVar6 = 0;
      do {
        plVar1 = *(long **)(CONCAT44(extraout_var,iVar3) + lVar6);
        geo = (Geometry *)(**(code **)(*plVar1 + 0x18))(plVar1);
        local_80 = geometry::Volume(geo);
        uVar2 = (**(code **)(*plVar1 + 0x20))(plVar1);
        local_b0.data_._0_4_ = CONCAT31(local_b0.data_._1_3_,uVar2);
        base::RefEl::ToString_abi_cxx11_((string *)local_a8,(RefEl *)&local_b0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)CONCAT71(local_a8._1_7_,local_a8[0]),
                            (long)local_a0);
        local_b8._M_head_impl._0_1_ = 0x20;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_b8,1);
        (*mesh->_vptr_Mesh[5])(mesh,plVar1);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": volume = ",0xb);
        poVar5 = std::ostream::_M_insert<double>(local_80);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1
                         );
        }
        local_88 = local_88 + local_80;
        lVar6 = lVar6 + 8;
      } while (extraout_RDX << 3 != lVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,">>> Total area = ",0x11);
    poVar5 = std::ostream::_M_insert<double>(local_88);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mesh sanity: Writing MATLAB file",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"test_mesh.m","");
    io::writeMatlab(mesh,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    utils::PrintInfo((ostream *)&std::cout,mesh,0x14);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"INCONSISTENT!",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    for (this = local_78.
                super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        this != local_78.
                super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
      base::RefEl::ToString_abi_cxx11_((string *)local_a8,&this->first);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)CONCAT71(local_a8._1_7_,local_a8[0]),
                          (long)local_a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1);
      }
    }
  }
  if (local_78.
      super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_60 == local_58;
}

Assistant:

bool mesh_sanity_check(const lf::mesh::Mesh& mesh) {
  std::cout << "Mesh sanity: Checking entity indexing" << std::endl;
  test_utils::checkEntityIndexing(mesh);

  std::cout << "Mesh sanity: Checking mesh completeness" << std::endl;
  test_utils::checkMeshCompleteness(mesh);

  std::cout << "Mesh sanity: Checking geometry compatibility: " << std::flush;
  lf::mesh::test_utils::WatertightLogger()->set_level(spdlog::level::trace);
  auto fails = lf::mesh::test_utils::isWatertightMesh(mesh, false);
  EXPECT_EQ(fails.size(), 0) << "Inconsistent geometry!";
  if (fails.size() == 0) {
    std::cout << "consistent!" << std::endl;
  } else {
    std::cout << "INCONSISTENT!" << std::endl;
    for (auto& geo_errs : fails) {
      std::cout << geo_errs.first.ToString() << "(" << geo_errs.second << ")"
                << std::endl;
    }
    return false;
  }

  // Compute volumes
  double total_area = 0.0;
  for (const mesh::Entity* cell : mesh.Entities(0)) {
    const double vol = Volume(*cell->Geometry());
    std::cout << cell->RefEl().ToString() << ' ' << mesh.Index(*cell)
              << ": volume = " << vol << std::endl;
    total_area += vol;
  }
  std::cout << ">>> Total area = " << total_area << std::endl;

  std::cout << "Mesh sanity: Writing MATLAB file" << std::endl;
  io::writeMatlab(mesh, "test_mesh.m");

  // Printing mesh information
  utils::PrintInfo(std::cout, mesh, 20);
  return true;
}